

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ProcessLoop(BackwardPass *this,BasicBlock *lastBlock)

{
  BasicBlock **ppBVar1;
  undefined1 *puVar2;
  Loop *loop;
  Type pJVar3;
  Loop *pLVar4;
  code *pcVar5;
  bool bVar6;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  undefined4 *puVar8;
  Type *ppFVar9;
  undefined1 uVar10;
  BasicBlock *block;
  BasicBlock *pBVar11;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  Iterator local_48;
  undefined1 local_31;
  
  bVar6 = IsTraceEnabled(this);
  if (bVar6) {
    Output::Print(L"******* PREPASS START ********\n");
  }
  loop = lastBlock->loop;
  uVar10 = this->isLoopPrepass;
  this->isLoopPrepass = true;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar6 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015aabd0,LiveOutFieldsPhase,sourceContextId,functionId);
  if ((bVar6) &&
     ((bVar6 = GlobOpt::DoFieldOpts(this->globOpt,loop), bVar6 ||
      (bVar6 = GlobOpt::DoObjTypeSpec(this->globOpt,loop), bVar6)))) {
    local_31 = uVar10;
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->func->m_fg->alloc,0x3eba5c);
    pJVar3 = this->func->m_fg->alloc;
    pBVar7->head = (Type_conflict)0x0;
    pBVar7->lastFoundIndex = (Type_conflict)0x0;
    pBVar7->alloc = pJVar3;
    pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
    pSVar12 = &(lastBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    local_48.list = pSVar12;
    local_48.current = &pSVar12->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (pSVar12 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_003d8082;
        *puVar8 = 0;
        pSVar12 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      }
      pSVar12 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar12->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar12 == local_48.list) break;
      local_48.current = (NodeBase *)pSVar12;
      ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
      pBVar11 = (*ppFVar9)->succBlock;
      if (pBVar11 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x666,"(blockSucc)","blockSucc");
        if (!bVar6) goto LAB_003d8082;
        *puVar8 = 0;
      }
      pLVar4 = pBVar11->loop;
      pSVar12 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      if (pLVar4 != loop) {
        if ((pLVar4 != (Loop *)0x0) && ((pLVar4->field_0x178 & 4) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x66d,"(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass)",
                             "!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass");
          if (!bVar6) goto LAB_003d8082;
          *puVar8 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                  (pBVar7,pBVar11->upwardExposedFields);
        pSVar12 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      }
    }
    lastBlock->loop->liveOutFields = pBVar7;
    uVar10 = local_31;
  }
  if ((this->tag == DeadStorePhase) && ((loop->field_0x178 & 2) == 0)) {
    if (this->isCollectionPass == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x679,"(!IsCollectionPass())","!IsCollectionPass()");
      if (!bVar6) goto LAB_003d8082;
      *puVar8 = 0;
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x67a,"(!IsPrePass())","!IsPrePass()");
      if (!bVar6) goto LAB_003d8082;
      *puVar8 = 0;
    }
    this->isCollectionPass = true;
    ProcessLoopCollectionPass(this,lastBlock);
    this->isCollectionPass = false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x680,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar6) goto LAB_003d8082;
    *puVar8 = 0;
  }
  this->currentPrePassLoop = loop;
  pBVar11 = lastBlock;
  if (this->tag == BackwardPhase) {
    if (loop->symsAssignedToInLoop != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x685,"(loop->symsAssignedToInLoop == nullptr)",
                         "loop->symsAssignedToInLoop == nullptr");
      if (!bVar6) goto LAB_003d8082;
      *puVar8 = 0;
    }
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3eba5c);
    pJVar3 = this->globOpt->alloc;
    pBVar7->head = (Type_conflict)0x0;
    pBVar7->lastFoundIndex = (Type_conflict)0x0;
    pBVar7->alloc = pJVar3;
    pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
    loop->symsAssignedToInLoop = pBVar7;
    if (loop->preservesNumberValue != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x687,"(loop->preservesNumberValue == nullptr)",
                         "loop->preservesNumberValue == nullptr");
      if (!bVar6) {
LAB_003d8082:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3eba5c);
    pJVar3 = this->globOpt->alloc;
    pBVar7->head = (Type_conflict)0x0;
    pBVar7->lastFoundIndex = (Type_conflict)0x0;
    pBVar7->alloc = pJVar3;
    pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
    loop->preservesNumberValue = pBVar7;
  }
  do {
    if ((((*(ushort *)&pBVar11->field_0x18 & 3) != 1) &&
        (ProcessBlock(this,pBVar11), (pBVar11->field_0x18 & 4) != 0)) &&
       (pBVar11->loop == lastBlock->loop)) break;
    ppBVar1 = &pBVar11->prev;
    pBVar11 = *ppBVar1;
  } while (*ppBVar1 != (BasicBlock *)0x0);
  this->currentPrePassLoop = (Loop *)0x0;
  puVar2 = &lastBlock->loop->field_0x178;
  *(ushort *)puVar2 = *(ushort *)puVar2 | 4;
  this->isLoopPrepass = (bool)uVar10;
  bVar6 = IsTraceEnabled(this);
  if (bVar6) {
    Output::Print(L"******** PREPASS END *********\n");
  }
  return;
}

Assistant:

void
BackwardPass::ProcessLoop(BasicBlock * lastBlock)
{
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******* PREPASS START ********\n"));
    }
#endif

    Loop *loop = lastBlock->loop;

    bool prevIsLoopPrepass = this->isLoopPrepass;
    this->isLoopPrepass = true;

    // This code doesn't work quite as intended. It is meant to capture fields that are live out of a loop to limit the
    // number of implicit call bailouts the forward pass must create (only compiler throughput optimization, no impact
    // on emitted code), but because it looks only at the lexically last block in the loop, it does the right thing only
    // for do-while loops. For other loops (for and while) the last block does not exit the loop. Even for do-while loops
    // this tracking can have the adverse effect of killing fields that should stay live after copy prop. Disabled by default.
    // Left in under a flag, in case we find compiler throughput issues and want to do additional experiments.
    if (PHASE_ON(Js::LiveOutFieldsPhase, this->func))
    {
        if (this->globOpt->DoFieldOpts(loop) || this->globOpt->DoFieldRefOpts(loop))
        {
            // Get the live-out set at the loop bottom.
            // This may not be the only loop exit, but all loop exits either leave the function or pass through here.
            // In the forward pass, we'll use this set to trim the live fields on exit from the loop
            // in order to limit the number of bailout points following the loop.
            BVSparse<JitArenaAllocator> *bv = JitAnew(this->func->m_fg->alloc, BVSparse<JitArenaAllocator>, this->func->m_fg->alloc);
            FOREACH_SUCCESSOR_BLOCK(blockSucc, lastBlock)
            {
                if (blockSucc->loop != loop)
                {
                    // Would like to assert this, but in strange exprgen cases involving "break LABEL" in nested
                    // loops the loop graph seems to get confused.
                    //Assert(!blockSucc->loop || blockSucc->loop->IsDescendentOrSelf(loop));
                    Assert(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass);

                    bv->Or(blockSucc->upwardExposedFields);
                }
            }
            NEXT_SUCCESSOR_BLOCK;
            lastBlock->loop->liveOutFields = bv;
        }
    }

    if(tag == Js::DeadStorePhase && !loop->hasDeadStoreCollectionPass)
    {
        Assert(!IsCollectionPass());
        Assert(!IsPrePass());
        isCollectionPass = true;
        ProcessLoopCollectionPass(lastBlock);
        isCollectionPass = false;
    }

    Assert(!this->IsPrePass());
    this->currentPrePassLoop = loop;

    if (tag == Js::BackwardPhase)
    {
        Assert(loop->symsAssignedToInLoop == nullptr);
        loop->symsAssignedToInLoop = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
        Assert(loop->preservesNumberValue == nullptr);
        loop->preservesNumberValue = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }

    FOREACH_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE(block, lastBlock, nullptr)
    {
        this->ProcessBlock(block);

        if (block->isLoopHeader && block->loop == lastBlock->loop)
        {
            break;
        }
    }
    NEXT_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE;

    this->currentPrePassLoop = nullptr;
    Assert(lastBlock);
    __analysis_assume(lastBlock);
    lastBlock->loop->hasDeadStorePrepass = true;

    this->isLoopPrepass = prevIsLoopPrepass;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******** PREPASS END *********\n"));
    }
#endif
}